

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O1

IPV4 * __thiscall
Network::Address::IPV4::getBroadcastAddress(IPV4 *__return_storage_ptr__,IPV4 *this)

{
  in_addr iVar1;
  bool bVar2;
  int iVar3;
  SpecialAddress SVar4;
  int index;
  IPV4 local;
  Type type;
  IPV4 mask;
  String mac;
  IPV4 gw;
  IPV4 local_90;
  Type local_74;
  IPV4 local_70;
  String local_58;
  IPV4 local_48;
  
  iVar3 = getLocalInterfacesCount();
  if (0 < iVar3) {
    index = 0;
    do {
      local_90.super_BaseAddress._vptr_BaseAddress = (_func_int **)&PTR_asText_00131150;
      local_90.address.sin_zero[0] = '\0';
      local_90.address.sin_zero[1] = '\0';
      local_90.address.sin_zero[2] = '\0';
      local_90.address.sin_zero[3] = '\0';
      local_90.address.sin_zero[4] = '\0';
      local_90.address.sin_zero[5] = '\0';
      local_90.address.sin_zero[6] = '\0';
      local_90.address.sin_zero[7] = '\0';
      local_90.address.sin_family = 2;
      local_90.address.sin_port = 0;
      local_90.address.sin_addr.s_addr = 0xffffffff;
      local_70.super_BaseAddress._vptr_BaseAddress = (_func_int **)&PTR_asText_00131150;
      local_70.address.sin_zero[0] = '\0';
      local_70.address.sin_zero[1] = '\0';
      local_70.address.sin_zero[2] = '\0';
      local_70.address.sin_zero[3] = '\0';
      local_70.address.sin_zero[4] = '\0';
      local_70.address.sin_zero[5] = '\0';
      local_70.address.sin_zero[6] = '\0';
      local_70.address.sin_zero[7] = '\0';
      local_70.address.sin_family = 2;
      local_70.address.sin_port = 0;
      local_70.address.sin_addr.s_addr = 0xffffffff;
      local_48.super_BaseAddress._vptr_BaseAddress = (_func_int **)&PTR_asText_00131150;
      local_48.address.sin_zero[0] = '\0';
      local_48.address.sin_zero[1] = '\0';
      local_48.address.sin_zero[2] = '\0';
      local_48.address.sin_zero[3] = '\0';
      local_48.address.sin_zero[4] = '\0';
      local_48.address.sin_zero[5] = '\0';
      local_48.address.sin_zero[6] = '\0';
      local_48.address.sin_zero[7] = '\0';
      local_48.address.sin_family = 2;
      local_48.address.sin_port = 0;
      local_48.address.sin_addr.s_addr = 0xffffffff;
      Bstrlib::String::String(&local_58);
      bVar2 = getLocalInterfaceDetails
                        (index,&local_90,&local_70,&local_48,&local_74,&local_58,(String *)0x0);
      if (((bVar2) &&
          (iVar1.s_addr = local_90.address.sin_addr.s_addr,
          local_90.address.sin_addr.s_addr == (this->address).sin_addr.s_addr)) &&
         (SVar4 = getSpecialAddressType(&local_90), (char)SVar4 != '\0')) {
        (__return_storage_ptr__->super_BaseAddress)._vptr_BaseAddress =
             (_func_int **)&PTR_asText_00131150;
        (__return_storage_ptr__->address).sin_family = 0;
        (__return_storage_ptr__->address).sin_port = 0;
        (__return_storage_ptr__->address).sin_addr = 0;
        (__return_storage_ptr__->address).sin_zero[0] = '\0';
        (__return_storage_ptr__->address).sin_zero[1] = '\0';
        (__return_storage_ptr__->address).sin_zero[2] = '\0';
        (__return_storage_ptr__->address).sin_zero[3] = '\0';
        (__return_storage_ptr__->address).sin_zero[4] = '\0';
        (__return_storage_ptr__->address).sin_zero[5] = '\0';
        (__return_storage_ptr__->address).sin_zero[6] = '\0';
        (__return_storage_ptr__->address).sin_zero[7] = '\0';
        (__return_storage_ptr__->address).sin_family = 2;
        (__return_storage_ptr__->address).sin_port = 0;
        (__return_storage_ptr__->address).sin_addr.s_addr =
             iVar1.s_addr | ~local_70.address.sin_addr.s_addr;
        Bstrlib::String::~String(&local_58);
        return __return_storage_ptr__;
      }
      Bstrlib::String::~String(&local_58);
      index = index + 1;
    } while (iVar3 != index);
  }
  (__return_storage_ptr__->super_BaseAddress)._vptr_BaseAddress = (_func_int **)&PTR_asText_00131150
  ;
  (__return_storage_ptr__->address).sin_family = 0;
  (__return_storage_ptr__->address).sin_port = 0;
  (__return_storage_ptr__->address).sin_addr = 0;
  (__return_storage_ptr__->address).sin_zero[0] = '\0';
  (__return_storage_ptr__->address).sin_zero[1] = '\0';
  (__return_storage_ptr__->address).sin_zero[2] = '\0';
  (__return_storage_ptr__->address).sin_zero[3] = '\0';
  (__return_storage_ptr__->address).sin_zero[4] = '\0';
  (__return_storage_ptr__->address).sin_zero[5] = '\0';
  (__return_storage_ptr__->address).sin_zero[6] = '\0';
  (__return_storage_ptr__->address).sin_zero[7] = '\0';
  (__return_storage_ptr__->address).sin_family = 2;
  (__return_storage_ptr__->address).sin_port = 0;
  (__return_storage_ptr__->address).sin_addr = 0xffffffff;
  return __return_storage_ptr__;
}

Assistant:

IPV4 IPV4::getBroadcastAddress() const
        {
            int i = getLocalInterfacesCount();
            for (int j = 0; j < i; j++)
            {
                IPV4 local, mask, gw;
                Type type;
                String mac;
                if (getLocalInterfaceDetails(j, local, mask, gw, type, mac))
                {
                    if (local.address.sin_addr.s_addr == address.sin_addr.s_addr && local.getSpecialAddressType() & UsableMask)
                    {
                        uint32 addr = (ntohl(local.address.sin_addr.s_addr) & ntohl(mask.address.sin_addr.s_addr)) | ~ ntohl(mask.address.sin_addr.s_addr);
                        return IPV4(addr);
                    }
                }
            }
            return IPV4();
        }